

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateBuilder
          (MessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FieldDescriptor *pFVar5;
  FieldGenerator *pFVar6;
  string *value;
  Descriptor *in_RDX;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  ulong uVar7;
  ulong extraout_RDX;
  int local_fc;
  undefined1 local_f8 [4];
  int i_2;
  uint local_d8;
  int local_d4;
  int i_1;
  int totalInts;
  int i;
  int totalBits;
  string local_a8;
  string local_88;
  string local_68;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  ClassName_abi_cxx11_(&local_38,(java *)this->descriptor_,in_RDX);
  io::Printer::Print(printer,
                     "public static Builder newBuilder() { return Builder.create(); }\npublic Builder newBuilderForType() { return newBuilder(); }\npublic static Builder newBuilder($classname$ prototype) {\n  return newBuilder().mergeFrom(prototype);\n}\npublic Builder toBuilder() { return newBuilder(this); }\n\n"
                     ,"classname",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar2 = HasNestedBuilders(this->descriptor_);
  if (bVar2) {
    io::Printer::Print(local_18,
                       "@java.lang.Override\nprotected Builder newBuilderForType(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  Builder builder = new Builder(parent);\n  return builder;\n}\n"
                      );
  }
  WriteMessageDocComment(local_18,this->descriptor_);
  iVar3 = Descriptor::extension_range_count(this->descriptor_);
  if (iVar3 < 1) {
    bVar2 = HasDescriptorMethods(this->descriptor_);
    pPVar1 = local_18;
    if (bVar2) {
      ClassName_abi_cxx11_(&local_a8,(java *)this->descriptor_,descriptor_00);
      io::Printer::Print(pPVar1,
                         "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage.Builder<Builder>\n   implements $classname$OrBuilder {\n"
                         ,"classname",&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else {
      ClassName_abi_cxx11_((string *)&i,(java *)this->descriptor_,descriptor_00);
      io::Printer::Print(pPVar1,
                         "public static final class Builder extends\n    com.google.protobuf.GeneratedMessageLite.Builder<\n      $classname$, Builder>\n    implements $classname$OrBuilder {\n"
                         ,"classname",(string *)&i);
      std::__cxx11::string::~string((string *)&i);
    }
  }
  else {
    bVar2 = HasDescriptorMethods(this->descriptor_);
    pPVar1 = local_18;
    if (bVar2) {
      ClassName_abi_cxx11_(&local_68,(java *)this->descriptor_,descriptor);
      io::Printer::Print(pPVar1,
                         "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage.ExtendableBuilder<\n      $classname$, Builder> implements $classname$OrBuilder {\n"
                         ,"classname",&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      ClassName_abi_cxx11_(&local_88,(java *)this->descriptor_,descriptor);
      io::Printer::Print(pPVar1,
                         "public static final class Builder extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<\n      $classname$, Builder> implements $classname$OrBuilder {\n"
                         ,"classname",&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  io::Printer::Indent(local_18);
  GenerateDescriptorMethods(this,local_18);
  GenerateCommonBuilderMethods(this,local_18);
  bVar2 = HasGeneratedMethods(this->descriptor_);
  if (bVar2) {
    GenerateIsInitialized(this,local_18,DONT_MEMOIZE);
    GenerateBuilderParsingMethods(this,local_18);
  }
  totalInts = 0;
  for (i_1 = 0; iVar3 = i_1, iVar4 = Descriptor::field_count(this->descriptor_), iVar3 < iVar4;
      i_1 = i_1 + 1) {
    pFVar5 = Descriptor::field(this->descriptor_,i_1);
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
    iVar3 = (*pFVar6->_vptr_FieldGenerator[3])();
    totalInts = iVar3 + totalInts;
  }
  local_d4 = (totalInts + 0x1f) / 0x20;
  uVar7 = (long)(totalInts + 0x1f) % 0x20 & 0xffffffff;
  for (local_d8 = 0; pPVar1 = local_18, (int)local_d8 < local_d4; local_d8 = local_d8 + 1) {
    GetBitFieldName_abi_cxx11_((string *)local_f8,(java *)(ulong)local_d8,(int)uVar7);
    io::Printer::Print(pPVar1,"private int $bit_field_name$;\n","bit_field_name",(string *)local_f8)
    ;
    std::__cxx11::string::~string((string *)local_f8);
    uVar7 = extraout_RDX;
  }
  for (local_fc = 0; iVar3 = Descriptor::field_count(this->descriptor_), pPVar1 = local_18,
      local_fc < iVar3; local_fc = local_fc + 1) {
    io::Printer::Print(local_18,"\n");
    pPVar1 = local_18;
    pFVar5 = Descriptor::field(this->descriptor_,local_fc);
    anon_unknown_5::PrintFieldComment(pPVar1,pFVar5);
    pFVar5 = Descriptor::field(this->descriptor_,local_fc);
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
    (*pFVar6->_vptr_FieldGenerator[6])(pFVar6,local_18);
  }
  value = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(pPVar1,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n","full_name"
                     ,value);
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  return;
}

Assistant:

void MessageGenerator::GenerateBuilder(io::Printer* printer) {
  printer->Print(
    "public static Builder newBuilder() { return Builder.create(); }\n"
    "public Builder newBuilderForType() { return newBuilder(); }\n"
    "public static Builder newBuilder($classname$ prototype) {\n"
    "  return newBuilder().mergeFrom(prototype);\n"
    "}\n"
    "public Builder toBuilder() { return newBuilder(this); }\n"
    "\n",
    "classname", ClassName(descriptor_));

  if (HasNestedBuilders(descriptor_)) {
     printer->Print(
      "@java.lang.Override\n"
      "protected Builder newBuilderForType(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  Builder builder = new Builder(parent);\n"
      "  return builder;\n"
      "}\n");
  }

  WriteMessageDocComment(printer, descriptor_);

  if (descriptor_->extension_range_count() > 0) {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage.ExtendableBuilder<\n"
        "      $classname$, Builder> implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    } else {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<\n"
        "      $classname$, Builder> implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    }
  } else {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage.Builder<Builder>\n"
         "   implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    } else {
      printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessageLite.Builder<\n"
        "      $classname$, Builder>\n"
        "    implements $classname$OrBuilder {\n",
        "classname", ClassName(descriptor_));
    }
  }
  printer->Indent();

  GenerateDescriptorMethods(printer);
  GenerateCommonBuilderMethods(printer);

  if (HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer, DONT_MEMOIZE);
    GenerateBuilderParsingMethods(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits += field_generators_.get(descriptor_->field(i))
        .GetNumBitsForBuilder();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    PrintFieldComment(printer, descriptor_->field(i));
    field_generators_.get(descriptor_->field(i))
                     .GenerateBuilderMembers(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}